

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void update_sourceview_cb(Fl_Button *param_1,void *param_2)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  if ((sourceview_panel != (Fl_Double_Window *)0x0) &&
     (((sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_ & 2) == 0)) {
    if (sv_source_filename == (char *)0x0) {
      sv_source_filename = (char *)malloc(0x800);
      Fl_Preferences::getUserdataPath(&fluid_prefs,sv_source_filename,0x800);
      fl_strlcat(sv_source_filename,"source_view_tmp.cxx",0x800);
    }
    if (sv_header_filename == (char *)0x0) {
      sv_header_filename = (char *)malloc(0x800);
      Fl_Preferences::getUserdataPath(&fluid_prefs,sv_header_filename,0x800);
      fl_strlcat(sv_header_filename,"source_view_tmp.h",0x800);
    }
    pcVar3 = fl_filename_name(sv_source_filename);
    fl_strlcpy(i18n_program,pcVar3,0x800);
    fl_filename_setext(i18n_program,0x800,"");
    pcVar1 = code_file_name;
    pcVar3 = header_file_name;
    code_file_name = sv_source_filename;
    header_file_name = sv_header_filename;
    write_sourceview = 1;
    iVar2 = write_code(sv_source_filename,sv_header_filename);
    if (iVar2 != 0) {
      iVar2 = Fl_Text_Display::get_absolute_top_line_number((Fl_Text_Display *)sv_source);
      Fl_Text_Buffer::loadfile
                ((sv_source->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.mBuffer,
                 sv_source_filename,0x20000);
      Fl_Text_Display::scroll((Fl_Text_Display *)sv_source,iVar2,0);
      iVar2 = Fl_Text_Display::get_absolute_top_line_number((Fl_Text_Display *)sv_header);
      Fl_Text_Buffer::loadfile
                ((sv_header->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.mBuffer,
                 sv_header_filename,0x20000);
      Fl_Text_Display::scroll((Fl_Text_Display *)sv_header,iVar2,0);
      update_sourceview_position();
    }
    write_sourceview = 0;
    header_file_name = pcVar3;
    code_file_name = pcVar1;
  }
  return;
}

Assistant:

void update_sourceview_cb(Fl_Button*, void*)
{
  if (!sourceview_panel || !sourceview_panel->visible())
    return;
  // generate space for the source and header file filenames
  if (!sv_source_filename) {
    sv_source_filename = (char*)malloc(FL_PATH_MAX);
    fluid_prefs.getUserdataPath(sv_source_filename, FL_PATH_MAX);
    strlcat(sv_source_filename, "source_view_tmp.cxx", FL_PATH_MAX);
  }
  if (!sv_header_filename) {
    sv_header_filename = (char*)malloc(FL_PATH_MAX);
    fluid_prefs.getUserdataPath(sv_header_filename, FL_PATH_MAX);
    strlcat(sv_header_filename, "source_view_tmp.h", FL_PATH_MAX);
  }

  strlcpy(i18n_program, fl_filename_name(sv_source_filename), sizeof(i18n_program));
  fl_filename_setext(i18n_program, sizeof(i18n_program), "");
  const char *code_file_name_bak = code_file_name;
  code_file_name = sv_source_filename;
  const char *header_file_name_bak = header_file_name;
  header_file_name = sv_header_filename;

  // generate the code and load the files
  write_sourceview = 1;
  // generate files
  if (write_code(sv_source_filename, sv_header_filename))
  {
    // load file into source editor
    int pos = sv_source->top_line();
    sv_source->buffer()->loadfile(sv_source_filename);
    sv_source->scroll(pos, 0);
    // load file into header editor
    pos = sv_header->top_line();
    sv_header->buffer()->loadfile(sv_header_filename);
    sv_header->scroll(pos, 0);
    // update the source code highlighting
    update_sourceview_position();
  }
  write_sourceview = 0;

  code_file_name = code_file_name_bak;
  header_file_name = header_file_name_bak;
}